

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall
Rml::ElementDocument::OnPropertyChange(ElementDocument *this,PropertyIdSet *changed_properties)

{
  bool bVar1;
  ElementStyle *this_00;
  PropertyIdSet *changed_properties_local;
  ElementDocument *this_local;
  
  Element::OnPropertyChange(&this->super_Element,changed_properties);
  bVar1 = PropertyIdSet::Contains(changed_properties,FontSize);
  if (bVar1) {
    this_00 = Element::GetStyle(&this->super_Element);
    ElementStyle::DirtyPropertiesWithUnitsRecursive(this_00,REM);
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,Top);
  if ((((bVar1) || (bVar1 = PropertyIdSet::Contains(changed_properties,Right), bVar1)) ||
      (bVar1 = PropertyIdSet::Contains(changed_properties,Bottom), bVar1)) ||
     (bVar1 = PropertyIdSet::Contains(changed_properties,Left), bVar1)) {
    DirtyPosition(this);
  }
  return;
}

Assistant:

void ElementDocument::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	Element::OnPropertyChange(changed_properties);

	// If the document's font-size has been changed, we need to dirty all rem properties.
	if (changed_properties.Contains(PropertyId::FontSize))
		GetStyle()->DirtyPropertiesWithUnitsRecursive(Unit::REM);

	if (changed_properties.Contains(PropertyId::Top) ||    //
		changed_properties.Contains(PropertyId::Right) ||  //
		changed_properties.Contains(PropertyId::Bottom) || //
		changed_properties.Contains(PropertyId::Left))
		DirtyPosition();
}